

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_entry.c
# Opt level: O3

char * archive_entry_hardlink(archive_entry *entry)

{
  wchar_t wVar1;
  char *in_RAX;
  int *piVar2;
  char *p;
  char *local_8;
  
  if ((entry->ae_set & L'\x01') != L'\0') {
    local_8 = in_RAX;
    wVar1 = archive_mstring_get_mbs(entry->archive,&entry->ae_hardlink,&local_8);
    if (wVar1 == L'\0') {
      return local_8;
    }
    piVar2 = __errno_location();
    if (*piVar2 == 0xc) {
      __archive_errx(1,"No memory");
    }
  }
  return (char *)0x0;
}

Assistant:

const char *
archive_entry_hardlink(struct archive_entry *entry)
{
	const char *p;
	if ((entry->ae_set & AE_SET_HARDLINK) == 0)
		return (NULL);
	if (archive_mstring_get_mbs(
	    entry->archive, &entry->ae_hardlink, &p) == 0)
		return (p);
	if (errno == ENOMEM)
		__archive_errx(1, "No memory");
	return (NULL);
}